

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
TestSchema::printNext(TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  char cVar1;
  ostream *poVar2;
  Validator *pVVar3;
  string fieldName;
  string recordName;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Next: \"");
  avro::operator<<(poVar2,*(Type *)&(p->reader_).field_0x18);
  local_28 = local_18;
  local_20 = 0;
  local_48 = local_38;
  local_40 = 0;
  local_18[0] = 0;
  local_38[0] = 0;
  pVVar3 = &(p->reader_).validator_;
  cVar1 = avro::Validator::getCurrentRecordName((string *)pVVar3);
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"\" record: \"");
    std::operator<<(poVar2,(string *)&local_28);
  }
  cVar1 = avro::Validator::getNextFieldName((string *)pVVar3);
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"\" field: \"");
    std::operator<<(poVar2,(string *)&local_48);
  }
  std::operator<<((ostream *)&std::cout,"\"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void printNext(Parser<ValidatingReader> &p)
    {
        std::cout << "Next: \"" << nextType(p);
        std::string recordName;
        std::string fieldName;
        if( currentRecordName(p, recordName) ) {
            std::cout << "\" record: \"" << recordName;
        }
        if( nextFieldName(p, fieldName) ) {
            std::cout << "\" field: \"" << fieldName;
        }
        std::cout << "\"\n";

    }